

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O2

void cmdline_parser_release(gengetopt_args_info *args_info)

{
  ulong uVar1;
  
  free_string_field(&args_info->output_arg);
  free_string_field(&args_info->output_orig);
  free_string_field(&args_info->latticeConstant_orig);
  free_string_field(&args_info->radius_orig);
  free_string_field(&args_info->length_orig);
  free_multiple_field(args_info->shellRadius_given,args_info->shellRadius_arg,
                      &args_info->shellRadius_orig);
  args_info->shellRadius_arg = (double *)0x0;
  free_multiple_field(args_info->molFraction_given,args_info->molFraction_arg,
                      &args_info->molFraction_orig);
  args_info->molFraction_arg = (double *)0x0;
  free_string_field(&args_info->vacancyPercent_orig);
  free_string_field(&args_info->vacancyInnerRadius_orig);
  free_string_field(&args_info->vacancyOuterRadius_orig);
  for (uVar1 = 0; uVar1 < args_info->inputs_num; uVar1 = uVar1 + 1) {
    free(args_info->inputs[uVar1]);
  }
  if (args_info->inputs_num != 0) {
    free(args_info->inputs);
  }
  args_info->molFraction_given = 0;
  args_info->vacancyPercent_given = 0;
  args_info->vacancyInnerRadius_given = 0;
  args_info->vacancyOuterRadius_given = 0;
  args_info->radius_given = 0;
  args_info->length_given = 0;
  args_info->shellRadius_given = 0;
  args_info->molFraction_given = 0;
  args_info->help_given = 0;
  args_info->version_given = 0;
  args_info->output_given = 0;
  args_info->latticeConstant_given = 0;
  return;
}

Assistant:

static void
cmdline_parser_release (struct gengetopt_args_info *args_info)
{
  unsigned int i;
  free_string_field (&(args_info->output_arg));
  free_string_field (&(args_info->output_orig));
  free_string_field (&(args_info->latticeConstant_orig));
  free_string_field (&(args_info->radius_orig));
  free_string_field (&(args_info->length_orig));
  free_multiple_field (args_info->shellRadius_given, (void *)(args_info->shellRadius_arg), &(args_info->shellRadius_orig));
  args_info->shellRadius_arg = 0;
  free_multiple_field (args_info->molFraction_given, (void *)(args_info->molFraction_arg), &(args_info->molFraction_orig));
  args_info->molFraction_arg = 0;
  free_string_field (&(args_info->vacancyPercent_orig));
  free_string_field (&(args_info->vacancyInnerRadius_orig));
  free_string_field (&(args_info->vacancyOuterRadius_orig));
  
  
  for (i = 0; i < args_info->inputs_num; ++i)
    free (args_info->inputs [i]);

  if (args_info->inputs_num)
    free (args_info->inputs);

  clear_given (args_info);
}